

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

void do_st_zpa(DisasContext_conflict1 *s,int zt,int pg,TCGv_i64 addr,int msz,int esz,int nreg)

{
  uint uVar1;
  int dtype;
  gen_helper_gvec_mem *pgStack_30;
  int be;
  gen_helper_gvec_mem *fn;
  int esz_local;
  int msz_local;
  TCGv_i64 addr_local;
  int pg_local;
  int zt_local;
  DisasContext_conflict1 *s_local;
  
  uVar1 = (uint)(s->be_data == MO_BE);
  if (nreg == 0) {
    pgStack_30 = do_st_zpa::fn_single[(int)uVar1][msz][esz];
  }
  else {
    if (msz != esz) {
      __assert_fail("msz == esz",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-sve.c"
                    ,0x140c,"void do_st_zpa(DisasContext *, int, int, TCGv_i64, int, int, int)");
    }
    pgStack_30 = do_st_zpa::fn_multiple[(int)uVar1][nreg + -1][msz];
  }
  if (pgStack_30 != (gen_helper_gvec_mem *)0x0) {
    dtype = msz_dtype(s,msz);
    do_mem_zpa(s,zt,pg,addr,dtype,pgStack_30);
    return;
  }
  __assert_fail("fn != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-sve.c"
                ,0x140f,"void do_st_zpa(DisasContext *, int, int, TCGv_i64, int, int, int)");
}

Assistant:

static void do_st_zpa(DisasContext *s, int zt, int pg, TCGv_i64 addr,
                      int msz, int esz, int nreg)
{
    static gen_helper_gvec_mem * const fn_single[2][4][4] = {
        { { gen_helper_sve_st1bb_r,
            gen_helper_sve_st1bh_r,
            gen_helper_sve_st1bs_r,
            gen_helper_sve_st1bd_r },
          { NULL,
            gen_helper_sve_st1hh_le_r,
            gen_helper_sve_st1hs_le_r,
            gen_helper_sve_st1hd_le_r },
          { NULL, NULL,
            gen_helper_sve_st1ss_le_r,
            gen_helper_sve_st1sd_le_r },
          { NULL, NULL, NULL,
            gen_helper_sve_st1dd_le_r } },
        { { gen_helper_sve_st1bb_r,
            gen_helper_sve_st1bh_r,
            gen_helper_sve_st1bs_r,
            gen_helper_sve_st1bd_r },
          { NULL,
            gen_helper_sve_st1hh_be_r,
            gen_helper_sve_st1hs_be_r,
            gen_helper_sve_st1hd_be_r },
          { NULL, NULL,
            gen_helper_sve_st1ss_be_r,
            gen_helper_sve_st1sd_be_r },
          { NULL, NULL, NULL,
            gen_helper_sve_st1dd_be_r } },
    };
    static gen_helper_gvec_mem * const fn_multiple[2][3][4] = {
        { { gen_helper_sve_st2bb_r,
            gen_helper_sve_st2hh_le_r,
            gen_helper_sve_st2ss_le_r,
            gen_helper_sve_st2dd_le_r },
          { gen_helper_sve_st3bb_r,
            gen_helper_sve_st3hh_le_r,
            gen_helper_sve_st3ss_le_r,
            gen_helper_sve_st3dd_le_r },
          { gen_helper_sve_st4bb_r,
            gen_helper_sve_st4hh_le_r,
            gen_helper_sve_st4ss_le_r,
            gen_helper_sve_st4dd_le_r } },
        { { gen_helper_sve_st2bb_r,
            gen_helper_sve_st2hh_be_r,
            gen_helper_sve_st2ss_be_r,
            gen_helper_sve_st2dd_be_r },
          { gen_helper_sve_st3bb_r,
            gen_helper_sve_st3hh_be_r,
            gen_helper_sve_st3ss_be_r,
            gen_helper_sve_st3dd_be_r },
          { gen_helper_sve_st4bb_r,
            gen_helper_sve_st4hh_be_r,
            gen_helper_sve_st4ss_be_r,
            gen_helper_sve_st4dd_be_r } },
    };
    gen_helper_gvec_mem *fn;
    int be = s->be_data == MO_BE;

    if (nreg == 0) {
        /* ST1 */
        fn = fn_single[be][msz][esz];
    } else {
        /* ST2, ST3, ST4 -- msz == esz, enforced by encoding */
        assert(msz == esz);
        fn = fn_multiple[be][nreg - 1][msz];
    }
    assert(fn != NULL);
    do_mem_zpa(s, zt, pg, addr, msz_dtype(s, msz), fn);
}